

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
containerptr_roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val,uint8_t *type,int *index)

{
  uint8_t uVar1;
  uint i;
  container_t *c;
  array_container_t *c_00;
  container_t *c_01;
  uint16_t x;
  uint8_t new_type;
  uint *local_38;
  
  x = (uint16_t)(val >> 0x10);
  local_38 = (uint *)index;
  i = ra_get_index(&r->high_low_container,x);
  if ((int)i < 0) {
    c_00 = array_container_create();
    c_01 = container_add(c_00,(uint16_t)val,'\x02',type);
    ra_insert_new_key_value_at(&r->high_low_container,~i,x,c_01,*type);
    *local_38 = ~i;
  }
  else {
    ra_unshare_container_at_index(&r->high_low_container,(uint16_t)i);
    new_type = (r->high_low_container).typecodes[i & 0xffff];
    *type = new_type;
    c_01 = (r->high_low_container).containers[i & 0xffff];
    c = container_add(c_01,(uint16_t)val,new_type,&new_type);
    *local_38 = i;
    if (c != c_01) {
      container_free(c_01,*type);
      uVar1 = new_type;
      ra_set_container_at_index(&r->high_low_container,i,c,new_type);
      *type = uVar1;
      c_01 = c;
    }
  }
  return c_01;
}

Assistant:

static inline container_t *containerptr_roaring_bitmap_add(
    roaring_bitmap_t *r, uint32_t val,
    uint8_t *type, int *index
){
    roaring_array_t *ra = &r->high_low_container;

    uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    if (i >= 0) {
        ra_unshare_container_at_index(ra, i);
        container_t *c = ra_get_container_at_index(ra, i, type);
        uint8_t new_type = *type;
        container_t *c2 = container_add(c, val & 0xFFFF, *type, &new_type);
        *index = i;
        if (c2 != c) {
            container_free(c, *type);
            ra_set_container_at_index(ra, i, c2, new_type);
            *type = new_type;
            return c2;
        } else {
            return c;
        }
    } else {
        array_container_t *new_ac = array_container_create();
        container_t *c = container_add(new_ac, val & 0xFFFF,
                                       ARRAY_CONTAINER_TYPE, type);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(ra, -i - 1, hb, c, *type);
        *index = -i - 1;
        return c;
    }
}